

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O1

bool pstore::repo::operator==(section_content *lhs,section_content *rhs)

{
  internal_fixup *__first1;
  internal_fixup *__last1;
  internal_fixup *__first2;
  external_fixup *peVar1;
  bool bVar2;
  external_fixup *this;
  external_fixup *rhs_00;
  
  if (lhs->kind != rhs->kind) {
    return false;
  }
  if ((lhs->align == rhs->align) && (bVar2 = pstore::operator==(&lhs->data,&rhs->data), bVar2)) {
    __first1 = (lhs->ifixups).
               super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start;
    __last1 = (lhs->ifixups).
              super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __first2 = (rhs->ifixups).
               super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (((long)__last1 - (long)__first1 ==
         (long)(rhs->ifixups).
               super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)__first2) &&
       (bVar2 = std::__equal<false>::
                equal<pstore::repo::internal_fixup_const*,pstore::repo::internal_fixup_const*>
                          (__first1,__last1,__first2), bVar2)) {
      this = (lhs->xfixups).
             super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
             ._M_impl.super__Vector_impl_data._M_start;
      peVar1 = (lhs->xfixups).
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      rhs_00 = (rhs->xfixups).
               super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((long)peVar1 - (long)this ==
          (long)(rhs->xfixups).
                super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)rhs_00) {
        if (this == peVar1) {
          return this == peVar1;
        }
        bVar2 = external_fixup::operator==(this,rhs_00);
        if (bVar2) {
          do {
            rhs_00 = rhs_00 + 1;
            this = this + 1;
            if (this == peVar1) {
              return this == peVar1;
            }
            bVar2 = external_fixup::operator==(this,rhs_00);
          } while (bVar2);
          return false;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator== (section_content const & lhs, section_content const & rhs) {
            return lhs.kind == rhs.kind && lhs.align == rhs.align && lhs.data == rhs.data &&
                   lhs.ifixups == rhs.ifixups && lhs.xfixups == rhs.xfixups;
        }